

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLABecLaplacian::averageDownCoeffsSameAmrLevel
          (MLABecLaplacian *this,int amrlev,
          Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a,
          Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          *b)

{
  FabArray<amrex::FArrayBox> *this_00;
  pointer pIVar1;
  pointer pMVar2;
  pointer paVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  initializer_list<const_amrex::MultiFab_*> __l;
  initializer_list<amrex::MultiFab_*> __l_00;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> crse;
  IntVect ratio;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> fine;
  long local_298;
  long local_290;
  Array4<const_int> local_200;
  long local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  Array4<double> local_1a8;
  Box local_164;
  Box local_148;
  Box local_12c;
  Array4<double> local_110;
  Array4<double> local_d0;
  undefined1 local_90 [32];
  int local_70;
  int local_68;
  
  uVar7 = (int)((long)(a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_start >> 7) * -0x55555555;
  if (1 < (int)uVar7) {
    lVar17 = (ulong)(uVar7 & 0x7fffffff) - 1;
    lVar8 = 0x180;
    lVar10 = 0x780;
    lVar15 = 0;
    do {
      if (amrlev < 1) {
        pIVar1 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.mg_coarsen_ratio_vec.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_110.jstride._0_4_ = *(undefined4 *)((long)pIVar1->vect + lVar15 + 8);
        local_110.p = *(double **)((long)pIVar1->vect + lVar15);
      }
      else {
        local_110.p = (double *)0x200000002;
        local_110.jstride._0_4_ = 2;
      }
      pMVar2 = (a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = (FabArray<amrex::FArrayBox> *)
                ((long)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        _vptr_FabArrayBase + lVar8);
      if ((this->m_a_scalar != 0.0) || (NAN(this->m_a_scalar))) {
        average_down((MultiFab *)
                     ((long)&pMVar2[-1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                             _vptr_FabArrayBase + lVar8),(MultiFab *)this_00,0,1,
                     (IntVect *)&local_110);
      }
      else {
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (this_00,0.0,0,
                   *(int *)((long)(&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                    n_grow + 1) + lVar8),
                   (IntVect *)
                   ((long)(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect
                   + lVar8));
      }
      paVar3 = (b->
               super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ).
               super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1a8.p = (double *)((long)paVar3 + lVar10 + -0x780);
      local_1a8.jstride = (long)paVar3 + lVar10 + -0x600;
      local_1a8.kstride =
           (long)&paVar3[-1]._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                  _vptr_FabArrayBase + lVar10;
      __l._M_len = 3;
      __l._M_array = (iterator)&local_1a8;
      std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
                ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 local_90,__l,(allocator_type *)&local_d0);
      paVar3 = (b->
               super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ).
               super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d0.kstride =
           (long)&paVar3->_M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                  _vptr_FabArrayBase + lVar10;
      local_d0.p = (double *)((long)paVar3 + lVar10 + -0x300);
      local_d0.jstride = (long)paVar3 + lVar10 + -0x180;
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)&local_d0;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1a8,__l_00,
                 (allocator_type *)&local_200);
      average_down_faces((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)local_90,
                         (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1a8
                         ,(IntVect *)&local_110,0);
      if (local_1a8.p != (double *)0x0) {
        operator_delete(local_1a8.p,local_1a8.kstride - (long)local_1a8.p);
      }
      if ((FabArrayBase *)local_90._0_8_ != (FabArrayBase *)0x0) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ - local_90._0_8_);
      }
      lVar8 = lVar8 + 0x180;
      lVar10 = lVar10 + 0x480;
      lVar15 = lVar15 + 0xc;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    if (1 < (int)uVar7) {
      uVar16 = 1;
      do {
        if (*(long *)(*(long *)&(this->super_MLCellABecLap).m_overset_mask.
                                super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     + uVar16 * 8) != 0) {
          dVar19 = (double)(1 << ((byte)uVar16 & 0x1f));
          uVar5 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])
                            (this);
          MFIter::MFIter((MFIter *)local_90,
                         (FabArrayBase *)
                         ((a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar16),true);
          if (local_70 < local_68) {
            dVar19 = (dVar19 + dVar19) / (dVar19 + 1.0);
            uVar6 = (ulong)uVar5;
            local_1c0 = uVar16 * 0x480;
            local_1b8 = uVar16;
            do {
              uVar16 = local_1b8;
              MFIter::nodaltilebox(&local_12c,(MFIter *)local_90,0);
              MFIter::nodaltilebox(&local_148,(MFIter *)local_90,1);
              MFIter::nodaltilebox(&local_164,(MFIter *)local_90,2);
              lVar8 = local_1c0;
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_1a8,
                         (FabArray<amrex::FArrayBox> *)
                         ((long)&((b->
                                  super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  ).
                                  super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].
                                 super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                 _vptr_FabArrayBase + local_1c0),(MFIter *)local_90);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_d0,
                         (FabArray<amrex::FArrayBox> *)
                         ((long)&((b->
                                  super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  ).
                                  super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1].
                                 super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                 _vptr_FabArrayBase + lVar8),(MFIter *)local_90);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_110,
                         (FabArray<amrex::FArrayBox> *)
                         ((long)&((b->
                                  super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  ).
                                  super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[2].
                                 super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                 _vptr_FabArrayBase + lVar8),(MFIter *)local_90);
              FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                        (&local_200,
                         *(FabArray<amrex::IArrayBox> **)
                          (*(long *)&(this->super_MLCellABecLap).m_overset_mask.
                                     super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          + uVar16 * 8),(MFIter *)local_90);
              if (0 < (int)uVar5) {
                local_290 = 0;
                uVar16 = 0;
                do {
                  local_1b0 = uVar16;
                  iVar4 = local_12c.smallend.vect[2];
                  if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
                    do {
                      if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                        lVar10 = ((long)iVar4 - (long)local_200.begin.z) * local_200.kstride;
                        lVar15 = (long)local_200.p +
                                 ((long)local_12c.smallend.vect[1] - (long)local_200.begin.y) *
                                 local_200.jstride * 4 + lVar10 * 4 + (long)local_200.begin.x * -4 +
                                 (long)local_12c.smallend.vect[0] * 4;
                        lVar8 = (long)local_12c.smallend.vect[1];
                        do {
                          if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                            lVar17 = local_1a8.nstride * local_290 +
                                     ((long)iVar4 - (long)local_1a8.begin.z) * local_1a8.kstride * 8
                                     + (lVar8 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                                     (long)local_1a8.begin.x * -8 +
                                     (long)local_12c.smallend.vect[0] * 8;
                            lVar9 = 0;
                            do {
                              if (*(int *)(lVar15 + lVar9 * 4) +
                                  local_200.p
                                  [lVar10 + (lVar8 - local_200.begin.y) * local_200.jstride +
                                            (long)(((local_12c.smallend.vect[0] + -1) -
                                                   local_200.begin.x) + (int)lVar9)] == 1) {
                                *(double *)((long)local_1a8.p + lVar9 * 8 + lVar17) =
                                     *(double *)((long)local_1a8.p + lVar9 * 8 + lVar17) * dVar19;
                              }
                              lVar9 = lVar9 + 1;
                            } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                                     (int)lVar9);
                          }
                          lVar8 = lVar8 + 1;
                          lVar15 = lVar15 + local_200.jstride * 4;
                        } while (local_12c.bigend.vect[1] + 1 != (int)lVar8);
                      }
                      bVar18 = iVar4 != local_12c.bigend.vect[2];
                      iVar4 = iVar4 + 1;
                    } while (bVar18);
                  }
                  local_290 = local_290 + 8;
                  uVar16 = local_1b0 + 1;
                } while (local_1b0 + 1 != uVar6);
                if (0 < (int)uVar5) {
                  lVar8 = (long)local_148.smallend.vect[0];
                  local_298 = 0;
                  uVar16 = 0;
                  do {
                    iVar4 = local_148.smallend.vect[2];
                    if (local_148.smallend.vect[2] <= local_148.bigend.vect[2]) {
                      do {
                        if (local_148.smallend.vect[1] <= local_148.bigend.vect[1]) {
                          lVar17 = ((long)iVar4 - (long)local_200.begin.z) * local_200.kstride;
                          lVar15 = local_200.jstride * 4;
                          iVar14 = (local_148.smallend.vect[1] + -1) - local_200.begin.y;
                          lVar9 = (long)local_200.p +
                                  ((long)local_148.smallend.vect[1] - (long)local_200.begin.y) *
                                  lVar15 + lVar17 * 4 + (long)local_200.begin.x * -4 + lVar8 * 4;
                          lVar10 = (long)local_148.smallend.vect[1];
                          do {
                            if (local_148.smallend.vect[0] <= local_148.bigend.vect[0]) {
                              lVar13 = local_d0.nstride * local_298 +
                                       ((long)iVar4 - (long)local_d0.begin.z) * local_d0.kstride * 8
                                       + (lVar10 - local_d0.begin.y) * local_d0.jstride * 8 +
                                       (long)local_d0.begin.x * -8 + lVar8 * 8;
                              lVar12 = 0;
                              do {
                                if (*(int *)(lVar9 + lVar12 * 4) +
                                    *(int *)((long)local_200.p +
                                            lVar12 * 4 +
                                            iVar14 * lVar15 +
                                            lVar17 * 4 + (long)local_200.begin.x * -4 + lVar8 * 4)
                                    == 1) {
                                  *(double *)((long)local_d0.p + lVar12 * 8 + lVar13) =
                                       *(double *)((long)local_d0.p + lVar12 * 8 + lVar13) * dVar19;
                                }
                                lVar12 = lVar12 + 1;
                              } while ((local_148.bigend.vect[0] - local_148.smallend.vect[0]) + 1
                                       != (int)lVar12);
                            }
                            lVar10 = lVar10 + 1;
                            iVar14 = iVar14 + 1;
                            lVar9 = lVar9 + lVar15;
                          } while (local_148.bigend.vect[1] + 1 != (int)lVar10);
                        }
                        bVar18 = iVar4 != local_148.bigend.vect[2];
                        iVar4 = iVar4 + 1;
                      } while (bVar18);
                    }
                    uVar16 = uVar16 + 1;
                    local_298 = local_298 + 8;
                  } while (uVar16 != uVar6);
                  if (0 < (int)uVar5) {
                    lVar10 = (long)local_164.smallend.vect[0];
                    lVar8 = 0;
                    uVar16 = 0;
                    do {
                      iVar4 = local_164.smallend.vect[2];
                      iVar14 = local_164.smallend.vect[2] + -1;
                      if (local_164.smallend.vect[2] <= local_164.bigend.vect[2]) {
                        do {
                          if (local_164.smallend.vect[1] <= local_164.bigend.vect[1]) {
                            lVar17 = local_200.jstride * 4;
                            lVar15 = ((long)local_164.smallend.vect[1] - (long)local_200.begin.y) *
                                     lVar17;
                            lVar13 = (long)local_200.p +
                                     ((long)iVar4 - (long)local_200.begin.z) * local_200.kstride * 4
                                     + lVar15 + (long)local_200.begin.x * -4 + lVar10 * 4;
                            lVar9 = (long)local_200.p +
                                    (long)(iVar14 - local_200.begin.z) * local_200.kstride * 4 +
                                    lVar15 + (long)local_200.begin.x * -4 + lVar10 * 4;
                            lVar15 = (long)local_164.smallend.vect[1];
                            do {
                              if (local_164.smallend.vect[0] <= local_164.bigend.vect[0]) {
                                lVar12 = local_110.nstride * lVar8 +
                                         ((long)iVar4 - (long)local_110.begin.z) * local_110.kstride
                                         * 8 + (lVar15 - local_110.begin.y) *
                                               CONCAT44(local_110.jstride._4_4_,
                                                        (undefined4)local_110.jstride) * 8 +
                                         (long)local_110.begin.x * -8 + lVar10 * 8;
                                lVar11 = 0;
                                do {
                                  if (*(int *)(lVar13 + lVar11 * 4) + *(int *)(lVar9 + lVar11 * 4)
                                      == 1) {
                                    *(double *)((long)local_110.p + lVar11 * 8 + lVar12) =
                                         *(double *)((long)local_110.p + lVar11 * 8 + lVar12) *
                                         dVar19;
                                  }
                                  lVar11 = lVar11 + 1;
                                } while ((local_164.bigend.vect[0] - local_164.smallend.vect[0]) + 1
                                         != (int)lVar11);
                              }
                              lVar15 = lVar15 + 1;
                              lVar13 = lVar13 + lVar17;
                              lVar9 = lVar9 + lVar17;
                            } while (local_164.bigend.vect[1] + 1 != (int)lVar15);
                          }
                          bVar18 = iVar4 != local_164.bigend.vect[2];
                          iVar4 = iVar4 + 1;
                          iVar14 = iVar14 + 1;
                        } while (bVar18);
                      }
                      uVar16 = uVar16 + 1;
                      lVar8 = lVar8 + 8;
                    } while (uVar16 != uVar6);
                  }
                }
              }
              MFIter::operator++((MFIter *)local_90);
              uVar16 = local_1b8;
            } while (local_70 < local_68);
          }
          MFIter::~MFIter((MFIter *)local_90);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uVar7 & 0x7fffffff));
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::averageDownCoeffsSameAmrLevel (int amrlev, Vector<MultiFab>& a,
                                                Vector<Array<MultiFab,AMREX_SPACEDIM> >& b)
{
    int nmglevs = a.size();
    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        IntVect ratio = (amrlev > 0) ? IntVect(mg_coarsen_ratio) : mg_coarsen_ratio_vec[mglev-1];

        if (m_a_scalar == 0.0)
        {
            a[mglev].setVal(0.0);
        }
        else
        {
            amrex::average_down(a[mglev-1], a[mglev], 0, 1, ratio);
        }

        Vector<const MultiFab*> fine {AMREX_D_DECL(&(b[mglev-1][0]),
                                                   &(b[mglev-1][1]),
                                                   &(b[mglev-1][2]))};
        Vector<MultiFab*> crse {AMREX_D_DECL(&(b[mglev][0]),
                                             &(b[mglev][1]),
                                             &(b[mglev][2]))};

        amrex::average_down_faces(fine, crse, ratio, 0);
    }

    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        if (m_overset_mask[amrlev][mglev]) {
            const Real fac = static_cast<Real>(1 << mglev); // 2**mglev
            const Real osfac = Real(2.0)*fac/(fac+Real(1.0));
            const int ncomp = getNComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(a[mglev],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                AMREX_D_TERM(Box const& xbx = mfi.nodaltilebox(0);,
                             Box const& ybx = mfi.nodaltilebox(1);,
                             Box const& zbx = mfi.nodaltilebox(2));
                AMREX_D_TERM(Array4<Real> const& bx = b[mglev][0].array(mfi);,
                             Array4<Real> const& by = b[mglev][1].array(mfi);,
                             Array4<Real> const& bz = b[mglev][2].array(mfi));
                Array4<int const> const& osm = m_overset_mask[amrlev][mglev]->const_array(mfi);
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, t_xbx,
                     {
                         overset_rescale_bcoef_x(t_xbx, bx, osm, ncomp, osfac);
                     },
                     ybx, t_ybx,
                     {
                         overset_rescale_bcoef_y(t_ybx, by, osm, ncomp, osfac);
                     },
                     zbx, t_zbx,
                     {
                         overset_rescale_bcoef_z(t_zbx, bz, osm, ncomp, osfac);
                     });
            }
        }
    }
}